

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application_info_filter_test.cpp
# Opt level: O3

int main(void)

{
  bool bVar1;
  bool bVar2;
  FILE *__stream;
  ApplicationInfoFilter *this;
  Hash HVar3;
  Hash HVar4;
  Hash HVar5;
  int iVar6;
  VkPhysicalDeviceMutableDescriptorTypeFeaturesEXT mutable_features;
  VkPhysicalDeviceFragmentShadingRateFeaturesKHR vrs_features;
  VkPhysicalDeviceDynamicRenderingFeatures dynamic_rendering_features;
  VkPhysicalDeviceBufferDeviceAddressFeatures bda_features;
  VkPhysicalDeviceVulkan13Features vulkan13_features;
  VkPhysicalDeviceDescriptorIndexingFeatures indexing_features;
  VkPhysicalDeviceFeatures2 features2;
  VkPhysicalDeviceVulkan12Features vulkan12_features;
  VkPhysicalDeviceProperties2 props2;
  VkApplicationInfo local_6c8;
  char *local_698;
  char *pcStack_690;
  Hash local_680;
  undefined8 local_678;
  undefined8 *puStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  Hash local_620;
  Hash local_618;
  _Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false> local_610;
  undefined8 local_608;
  undefined8 *puStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 *puStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined4 local_538 [2];
  undefined8 *local_530;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined4 local_3e8;
  undefined4 local_3a0;
  VkPhysicalDeviceProperties2 local_378;
  
  __stream = fopen(".__test_appinfo.json","w");
  if (__stream == (FILE *)0x0) {
    iVar6 = 1;
  }
  else {
    fprintf(__stream,"%s\n",
            "\n{\n\t\"asset\": \"FossilizeApplicationInfoFilter\",\n\t\"version\" : 2,\n\t\"blacklistedApplicationNames\" : [ \"A\",  \"B\", \"C\" ],\n\t\"blacklistedEngineNames\" : [ \"D\", \"E\", \"F\" ],\n\t\"applicationFilters\" : {\n\t\t\"test1\" : { \"minimumApplicationVersion\" : 10 },\n\t\t\"test2\" : { \"minimumApplicationVersion\" : 10, \"minimumEngineVersion\" : 1000 },\n\t\t\"test3\" : { \"minimumApiVersion\" : 50 },\n\t\t\"test4\" : {\n\t\t\t\"blacklistedEnvironments\" : {\n\t\t\t\t\"TEST_ENV\" : { \"contains\" : \"foo\", \"equals\" : \"bar\" },\n\t\t\t\t\"TEST_ENV\" : { \"equals\" : \"bar2\", \"contains\": \"\" },\n\t\t\t\t\"TEST\" : { \"nonnull\" : true }\n\t\t\t}\n\t\t},\n\t\t\"test5\" : { \"recordImmutableSamplers\" : true },\n\t\t\"test6\" : { \"recordImmutableSamplers\" : false }\n\t},\n\t\"engineFilters\" : {\n\t\t\"test1\" : {\n\t\t\t\"minimumEngineVersion\" : 10,\n\t\t\t\"bucketVariantDependencies\" : [\n\t\t\t\t\"BindlessUBO\",\n\t\t\t\t\"VendorID\",\n\t\t\t\t\"MutableDescriptorType\",\n\t\t\t\t\"BufferDeviceAddress\",\n\t\t\t\t\"DummyIgnored\",\n\t\t\t\t\"ApplicationName\",\n\t\t\t\t\"FragmentShadingRate\",\n\t\t\t\t\"DynamicRendering\"\n\t\t\t]\n\t\t},\n\t\t\"variance\" : {\n\t\t\t\"bucketVariantDependencies\" : [ \"VendorID\" ]\n\t\t},\n\t\t\"variance2\" : {\n\t\t\t\"bucketVariantDependencies\" : [ \"VendorID\" ],\n\t\t\t\"bucketVariantFeatureDependencies\" : [\n\t\t\t\t\"BindlessUBO\",\n\t\t\t\t\"MutableDescriptorType\",\n\t\t\t\t\"BufferDeviceAddress\",\n\t\t\t\t\"DummyIgnored\",\n\t\t\t\t\"FragmentShadingRate\",\n\t\t\t\t\"DynamicRendering\",\n\t\t\t\t\"DescriptorBuffer\"\n\t\t\t]\n\t\t},\n\t\t\"test2\" : { \"minimumEngineVersion\" : 10, \"minimumApplicationVersion\" : 1000 },\n\t\t\"test3\" : { \"minimumApiVersion\" : 50 },\n\t\t\"test4\" : {\n\t\t\t\"blacklistedEnvironments\" : {\n\t\t\t\t\"TEST_ENV\" : { \"contains\" : \"foo\", \"equals\" : \"bar\" },\n\t\t\t\t\"TEST_ENV\" : { \"equals\" : \"bar2\", \"contains\": \"\" },\n\t\t\t\t\"TEST\" : { \"nonnull\" : true }\n\t\t\t}\n\t\t},\n\t\t\"test5\" : { \"recordImmutableSamplers\" : false },\n\t\t\"test6\" : { \"recordImmutableSamplers\" : true }\n\t},\n\t\"defaultBucketVariantDependencies\" : [\n\t\t\"ApplicationName\",\n\t\t\"EngineName\"\n\t],\n\t\"defaultBucketVariantFeatureDependencies\" : [\n\t\t\"DescriptorBuffer\"\n\t]\n}\n"
           );
    fclose(__stream);
    local_698 = (char *)0x0;
    pcStack_690 = (char *)0x0;
    this = Fossilize::ApplicationInfoFilter::parse
                     (".__test_appinfo.json",main::anon_class_1_0_00000001::__invoke,&local_698);
    local_610._M_head_impl = this;
    if (this == (ApplicationInfoFilter *)0x0) {
      main_cold_1();
      iVar6 = 1;
    }
    else {
      local_6c8.pEngineName = (char *)0x0;
      local_6c8.engineVersion = 0;
      local_6c8.apiVersion = 0;
      local_6c8.pApplicationName = (char *)0x0;
      local_6c8._24_8_ = 0;
      local_6c8.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      local_6c8._4_4_ = 0;
      local_6c8.pNext = (void *)0x0;
      bVar2 = Fossilize::ApplicationInfoFilter::test_application_info(this,(VkApplicationInfo *)0x0)
      ;
      iVar6 = 1;
      if (bVar2) {
        local_6c8.pApplicationName = "A";
        local_6c8.pEngineName = "G";
        bVar2 = Fossilize::ApplicationInfoFilter::test_application_info(this,&local_6c8);
        if (!bVar2) {
          local_6c8.pApplicationName = "D";
          local_6c8.pEngineName = "A";
          bVar2 = Fossilize::ApplicationInfoFilter::test_application_info(this,&local_6c8);
          if (bVar2) {
            local_6c8.pApplicationName = "H";
            local_6c8.pEngineName = "E";
            bVar2 = Fossilize::ApplicationInfoFilter::test_application_info(this,&local_6c8);
            if (!bVar2) {
              local_6c8.pApplicationName = "test1";
              local_6c8.pEngineName = (char *)0x0;
              local_6c8.applicationVersion = 9;
              bVar2 = Fossilize::ApplicationInfoFilter::test_application_info(this,&local_6c8);
              if (!bVar2) {
                local_6c8.applicationVersion = 10;
                bVar2 = Fossilize::ApplicationInfoFilter::test_application_info(this,&local_6c8);
                if (bVar2) {
                  local_6c8.pApplicationName = "test2";
                  bVar2 = Fossilize::ApplicationInfoFilter::test_application_info(this,&local_6c8);
                  if (bVar2) {
                    local_6c8.pApplicationName = "test3";
                    local_6c8._24_8_ = local_6c8._24_8_ & 0xffffffff00000000;
                    local_6c8.apiVersion = 0x31;
                    bVar2 = Fossilize::ApplicationInfoFilter::test_application_info(this,&local_6c8)
                    ;
                    if (!bVar2) {
                      local_6c8.apiVersion = 0x32;
                      bVar2 = Fossilize::ApplicationInfoFilter::test_application_info
                                        (this,&local_6c8);
                      if (bVar2) {
                        local_6c8.pApplicationName = (char *)0x0;
                        local_6c8.pEngineName = "test1";
                        local_6c8.engineVersion = 9;
                        bVar2 = Fossilize::ApplicationInfoFilter::test_application_info
                                          (this,&local_6c8);
                        if (!bVar2) {
                          local_6c8.engineVersion = 10;
                          bVar2 = Fossilize::ApplicationInfoFilter::test_application_info
                                            (this,&local_6c8);
                          if (bVar2) {
                            local_6c8.pEngineName = "test2";
                            bVar2 = Fossilize::ApplicationInfoFilter::test_application_info
                                              (this,&local_6c8);
                            if (bVar2) {
                              local_6c8.pEngineName = "test3";
                              local_6c8.engineVersion = 0;
                              local_6c8.apiVersion = 0x31;
                              bVar2 = Fossilize::ApplicationInfoFilter::test_application_info
                                                (this,&local_6c8);
                              if (!bVar2) {
                                local_6c8.apiVersion = 0x32;
                                bVar2 = Fossilize::ApplicationInfoFilter::test_application_info
                                                  (this,&local_6c8);
                                if (bVar2) {
                                  local_6c8._40_8_ = local_6c8._40_8_ & 0xffffffff00000000;
                                  local_6c8._24_8_ = local_6c8._24_8_ & 0xffffffff00000000;
                                  bVar2 = true;
                                  do {
                                    bVar1 = bVar2;
                                    local_698 = (char *)0x0;
                                    pcStack_690 = (char *)0x0;
                                    local_6c8.pApplicationName = (char *)0x0;
                                    local_6c8.pEngineName = "test4";
                                    if (bVar1) {
                                      local_6c8.pApplicationName = "test4";
                                      local_6c8.pEngineName = (char *)0x0;
                                    }
                                    bVar2 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      (this,&local_6c8);
                                    if (!bVar2) goto LAB_00104081;
                                    local_698 = "TEST_FOO";
                                    pcStack_690 = "foo";
                                    bVar2 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      (this,&local_6c8);
                                    if (!bVar2) goto LAB_00104081;
                                    local_698 = "TEST_ENV";
                                    pcStack_690 = "foo";
                                    bVar2 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      (this,&local_6c8);
                                    if (bVar2) goto LAB_00104081;
                                    pcStack_690 = "Afoo";
                                    bVar2 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      (this,&local_6c8);
                                    if (bVar2) goto LAB_00104081;
                                    pcStack_690 = "fooA";
                                    bVar2 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      (this,&local_6c8);
                                    if (bVar2) goto LAB_00104081;
                                    pcStack_690 = "bar";
                                    bVar2 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      (this,&local_6c8);
                                    if (bVar2) goto LAB_00104081;
                                    pcStack_690 = "bar2";
                                    bVar2 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      (this,&local_6c8);
                                    if (bVar2) goto LAB_00104081;
                                    pcStack_690 = "bar3";
                                    bVar2 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      (this,&local_6c8);
                                    if (!bVar2) goto LAB_00104081;
                                    local_698 = "TEST";
                                    pcStack_690 = (char *)0x0;
                                    bVar2 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      (this,&local_6c8);
                                    if (!bVar2) goto LAB_00104081;
                                    pcStack_690 = "";
                                    bVar2 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      (this,&local_6c8);
                                    if (bVar2) goto LAB_00104081;
                                    bVar2 = false;
                                  } while (bVar1);
                                  local_6c8.pEngineName = (char *)0x0;
                                  local_6c8.pApplicationName = "test1";
                                  bVar2 = Fossilize::ApplicationInfoFilter::needs_buckets
                                                    (this,&local_6c8);
                                  if (bVar2) {
                                    local_6c8.pEngineName = "test1";
                                    local_6c8.pApplicationName = (char *)0x0;
                                    bVar2 = Fossilize::ApplicationInfoFilter::needs_buckets
                                                      (this,&local_6c8);
                                    if (bVar2) {
                                      Fossilize::ApplicationInfoFilter::get_bucket_hash
                                                (this,(VkPhysicalDeviceProperties2 *)0x0,
                                                 (VkApplicationInfo *)0x0,(void *)0x0);
                                      HVar3 = Fossilize::ApplicationInfoFilter::get_bucket_hash
                                                        (this,(VkPhysicalDeviceProperties2 *)0x0,
                                                         &local_6c8,(void *)0x0);
                                      memset(&local_378,0,0x348);
                                      local_378.sType =
                                           VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2;
                                      local_378.properties.vendorID = 1;
                                      HVar4 = Fossilize::ApplicationInfoFilter::get_bucket_hash
                                                        (this,&local_378,&local_6c8,(void *)0x0);
                                      if (HVar3 != HVar4) {
                                        local_5f8 = 0;
                                        uStack_5f0 = 0;
                                        local_608 = 0x3b9eb5e8;
                                        puStack_600 = (undefined8 *)0x0;
                                        memset(&local_448,0,0xd0);
                                        local_448 = CONCAT44(local_448._4_4_,0x33);
                                        uStack_5e0 = 0;
                                        local_5a8 = 0;
                                        uStack_5a0 = 0;
                                        local_5b8 = 0;
                                        uStack_5b0 = 0;
                                        local_5c8 = 0;
                                        uStack_5c0 = 0;
                                        local_5d8 = 0;
                                        uStack_5d0 = 0;
                                        local_5e8 = 0x35;
                                        puStack_600 = &local_598;
                                        local_548 = 0;
                                        uStack_540 = 0;
                                        local_558 = 0;
                                        uStack_550 = 0;
                                        local_568 = 0;
                                        uStack_560 = 0;
                                        local_578 = 0;
                                        uStack_570 = 0;
                                        local_588 = 0;
                                        uStack_580 = 0;
                                        local_598 = 0x3b9d3ee9;
                                        puStack_590 = &local_678;
                                        local_668 = 0;
                                        local_678 = 0x3ba02518;
                                        puStack_670 = (undefined8 *)0x0;
                                        local_648 = 0;
                                        uStack_640 = 0;
                                        local_658 = 0x3b9e3cd3;
                                        uStack_650 = 0;
                                        local_628 = 0;
                                        local_638 = 0x3b9b75e3;
                                        uStack_630 = 0;
                                        memset(local_538,0,0xf0);
                                        local_538[0] = 0x3b9bb078;
                                        local_530 = &local_608;
                                        HVar3 = Fossilize::ApplicationInfoFilter::get_bucket_hash
                                                          (this,&local_378,&local_6c8,local_538);
                                        if (HVar4 == HVar3) {
                                          local_5f8 = CONCAT44(local_5f8._4_4_,1);
                                          HVar3 = Fossilize::ApplicationInfoFilter::get_bucket_hash
                                                            (this,&local_378,&local_6c8,local_538);
                                          if (HVar4 != HVar3) {
                                            uStack_560 = CONCAT44(uStack_560._4_4_,1);
                                            HVar4 = Fossilize::ApplicationInfoFilter::
                                                    get_bucket_hash(this,&local_378,&local_6c8,
                                                                    local_538);
                                            if (HVar3 != HVar4) {
                                              local_668 = CONCAT44(local_668._4_4_,1);
                                              HVar3 = Fossilize::ApplicationInfoFilter::
                                                      get_bucket_hash(this,&local_378,&local_6c8,
                                                                      local_538);
                                              if (HVar4 != HVar3) {
                                                local_530 = &local_678;
                                                local_3e8 = 1;
                                                local_3a0 = 1;
                                                puStack_670 = &local_448;
                                                HVar4 = Fossilize::ApplicationInfoFilter::
                                                        get_bucket_hash(this,&local_378,&local_6c8,
                                                                        local_538);
                                                if (HVar3 == HVar4) {
                                                  local_530 = (undefined8 *)0x0;
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash(this,&local_378,&local_6c8
                                                                          ,local_538);
                                                  local_530 = &local_658;
                                                  HVar4 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash(this,&local_378,&local_6c8
                                                                          ,local_538);
                                                  if (HVar3 == HVar4) {
                                                    local_648 = CONCAT44(1,(undefined4)local_648);
                                                    HVar4 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash(this,&local_378,
                                                                            &local_6c8,local_538);
                                                    if (HVar3 != HVar4) {
                                                      local_648 = 1;
                                                      HVar3 = Fossilize::ApplicationInfoFilter::
                                                              get_bucket_hash(this,&local_378,
                                                                              &local_6c8,local_538);
                                                      if (HVar4 != HVar3) {
                                                        local_648 = local_648 & 0xffffffff00000000;
                                                        uStack_640 = CONCAT44(uStack_640._4_4_,1);
                                                        HVar4 = Fossilize::ApplicationInfoFilter::
                                                                get_bucket_hash(this,&local_378,
                                                                                &local_6c8,local_538
                                                                               );
                                                        if (HVar3 != HVar4) {
                                                          local_530 = (undefined8 *)0x0;
                                                          HVar3 = Fossilize::ApplicationInfoFilter::
                                                                  get_bucket_hash(this,&local_378,
                                                                                  &local_6c8,
                                                                                  local_538);
                                                          local_530 = &local_638;
                                                          HVar4 = Fossilize::ApplicationInfoFilter::
                                                                  get_bucket_hash(this,&local_378,
                                                                                  &local_6c8,
                                                                                  local_538);
                                                          if (HVar3 == HVar4) {
                                                            local_628 = CONCAT44(local_628._4_4_,1);
                                                            HVar4 = Fossilize::ApplicationInfoFilter
                                                                    ::get_bucket_hash(this,&
                                                  local_378,&local_6c8,local_538);
                                                  if (HVar3 != HVar4) {
                                                    local_5a8 = CONCAT44(local_5a8._4_4_,1);
                                                    local_530 = &local_5e8;
                                                    HVar3 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash(this,&local_378,
                                                                            &local_6c8,local_538);
                                                    if (HVar4 == HVar3) {
                                                      local_6c8.pApplicationName = "foo";
                                                      HVar3 = Fossilize::ApplicationInfoFilter::
                                                              get_bucket_hash(this,&local_378,
                                                                              &local_6c8,local_538);
                                                      if (HVar3 != HVar4) {
                                                        local_6c8.pApplicationName = "blah";
                                                        local_6c8.pEngineName = "blah2";
                                                        HVar3 = Fossilize::ApplicationInfoFilter::
                                                                get_bucket_hash(this,&local_378,
                                                                                &local_6c8,local_538
                                                                               );
                                                        HVar4 = Fossilize::ApplicationInfoFilter::
                                                                get_bucket_hash(this,&local_378,
                                                                                &local_6c8,
                                                                                (void *)0x0);
                                                        iVar6 = 1;
                                                        if (HVar3 == HVar4) {
                                                          memset(&local_378,0,0x348);
                                                          local_378.sType =
                                                                                                                              
                                                  VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2;
                                                  memset(local_538,0,0xf0);
                                                  local_538[0] = 0x3b9bb078;
                                                  local_5f8 = 0;
                                                  uStack_5f0 = 0;
                                                  local_608 = 0x3b9eb5e8;
                                                  puStack_600 = (undefined8 *)0x0;
                                                  memset(&local_448,0,0xd0);
                                                  local_448 = CONCAT44(local_448._4_4_,0x33);
                                                  uStack_5e0 = 0;
                                                  local_5a8 = 0;
                                                  uStack_5a0 = 0;
                                                  local_5b8 = 0;
                                                  uStack_5b0 = 0;
                                                  local_5c8 = 0;
                                                  uStack_5c0 = 0;
                                                  local_5d8 = 0;
                                                  uStack_5d0 = 0;
                                                  local_5e8 = 0x35;
                                                  puStack_590 = (undefined8 *)0x0;
                                                  local_548 = 0;
                                                  uStack_540 = 0;
                                                  local_558 = 0;
                                                  uStack_550 = 0;
                                                  local_568 = 0;
                                                  uStack_560 = 0;
                                                  local_578 = 0;
                                                  uStack_570 = 0;
                                                  local_588 = 0;
                                                  uStack_580 = 0;
                                                  local_598 = 0x3b9d3ee9;
                                                  local_628 = 0;
                                                  local_638 = 0x3ba02518;
                                                  uStack_630 = 0;
                                                  local_648 = 0;
                                                  uStack_640 = 0;
                                                  local_658 = 0x3b9e3cd3;
                                                  uStack_650 = 0;
                                                  local_668 = 0;
                                                  uStack_660 = 0;
                                                  local_678 = 0x3b9f9c62;
                                                  puStack_670 = (undefined8 *)0x0;
                                                  local_378.properties.vendorID = 1;
                                                  local_6c8.pEngineName = "variance";
                                                  local_6c8.pApplicationName = (char *)0x0;
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash(this,&local_378,&local_6c8
                                                                          ,local_538);
                                                  local_6c8.pEngineName = "variance2";
                                                  HVar4 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash(this,&local_378,&local_6c8
                                                                          ,local_538);
                                                  if (HVar3 == HVar4) {
                                                    local_530 = &local_678;
                                                    HVar4 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash(this,&local_378,
                                                                            &local_6c8,local_538);
                                                    if (HVar4 == HVar3) {
                                                      local_530 = &local_608;
                                                      HVar4 = Fossilize::ApplicationInfoFilter::
                                                              get_bucket_hash(this,&local_378,
                                                                              &local_6c8,local_538);
                                                      if (HVar4 == HVar3) {
                                                        local_530 = &local_448;
                                                        HVar4 = Fossilize::ApplicationInfoFilter::
                                                                get_bucket_hash(this,&local_378,
                                                                                &local_6c8,local_538
                                                                               );
                                                        if ((HVar4 == HVar3) &&
                                                           (local_530 = &local_5e8,
                                                           HVar4 = Fossilize::ApplicationInfoFilter
                                                                   ::get_bucket_hash(this,&local_378
                                                                                     ,&local_6c8,
                                                                                     local_538),
                                                           HVar4 == HVar3)) {
                                                          local_530 = &local_598;
                                                          HVar4 = Fossilize::ApplicationInfoFilter::
                                                                  get_bucket_hash(this,&local_378,
                                                                                  &local_6c8,
                                                                                  local_538);
                                                          if (HVar4 == HVar3) {
                                                            local_530 = &local_638;
                                                            HVar4 = Fossilize::ApplicationInfoFilter
                                                                    ::get_bucket_hash(this,&
                                                  local_378,&local_6c8,local_538);
                                                  if (HVar4 == HVar3) {
                                                    local_530 = &local_658;
                                                    HVar4 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash(this,&local_378,
                                                                            &local_6c8,local_538);
                                                    if (HVar4 == HVar3) {
                                                      local_530 = &local_678;
                                                      local_668 = CONCAT44(local_668._4_4_,1);
                                                      HVar4 = Fossilize::ApplicationInfoFilter::
                                                              get_bucket_hash(this,&local_378,
                                                                              &local_6c8,local_538);
                                                      uStack_660 = CONCAT44(1,(undefined4)uStack_660
                                                                           );
                                                      HVar5 = Fossilize::ApplicationInfoFilter::
                                                              get_bucket_hash(this,&local_378,
                                                                              &local_6c8,local_538);
                                                      if ((HVar3 != HVar4) && (HVar4 != HVar5)) {
                                                        local_530 = &local_608;
                                                        local_5f8 = CONCAT44(local_5f8._4_4_,1);
                                                        HVar4 = Fossilize::ApplicationInfoFilter::
                                                                get_bucket_hash(this,&local_378,
                                                                                &local_6c8,local_538
                                                                               );
                                                        if (HVar3 != HVar4) {
                                                          local_530 = &local_448;
                                                          local_3a0 = 1;
                                                          HVar3 = Fossilize::ApplicationInfoFilter::
                                                                  get_bucket_hash(this,&local_378,
                                                                                  &local_6c8,
                                                                                  local_538);
                                                          iVar6 = 1;
                                                          if (HVar4 == HVar3) {
                                                            memset(&local_378,0,0x348);
                                                            local_378.sType =
                                                                                                                                  
                                                  VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2;
                                                  memset(local_538,0,0xf0);
                                                  local_538[0] = 0x3b9bb078;
                                                  local_438 = 0;
                                                  uStack_430 = 0;
                                                  local_448 = 0x3b9eb5e8;
                                                  uStack_440 = 0;
                                                  local_588 = 0;
                                                  uStack_580 = 0;
                                                  local_598 = 0x3b9f9c62;
                                                  puStack_590 = (undefined8 *)0x0;
                                                  iVar6 = 1;
                                                  local_378.properties.vendorID = 1;
                                                  local_6c8.pEngineName = (char *)0x0;
                                                  local_6c8.pApplicationName = (char *)0x0;
                                                  local_618 = Fossilize::ApplicationInfoFilter::
                                                              get_bucket_hash(this,&local_378,
                                                                              &local_6c8,local_538);
                                                  local_530 = &local_448;
                                                  local_438 = CONCAT44(local_438._4_4_,1);
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash(this,&local_378,&local_6c8
                                                                          ,local_538);
                                                  local_530 = &local_598;
                                                  local_620 = Fossilize::ApplicationInfoFilter::
                                                              get_bucket_hash(this,&local_378,
                                                                              &local_6c8,local_538);
                                                  local_588 = CONCAT44(local_588._4_4_,1);
                                                  local_680 = Fossilize::ApplicationInfoFilter::
                                                              get_bucket_hash(this,&local_378,
                                                                              &local_6c8,local_538);
                                                  uStack_580 = CONCAT44(1,(undefined4)uStack_580);
                                                  HVar4 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash(this,&local_378,&local_6c8
                                                                          ,local_538);
                                                  if ((((local_618 == HVar3) && (HVar3 == local_620)
                                                       ) && (local_618 != local_680)) &&
                                                     (local_680 != HVar4)) {
                                                    local_6c8.pApplicationName = "test5";
                                                    local_6c8.pEngineName = (char *)0x0;
                                                    bVar2 = Fossilize::ApplicationInfoFilter::
                                                            should_record_immutable_samplers
                                                                      (this,&local_6c8);
                                                    if (bVar2) {
                                                      local_6c8.pApplicationName = "test6";
                                                      bVar2 = Fossilize::ApplicationInfoFilter::
                                                              should_record_immutable_samplers
                                                                        (this,&local_6c8);
                                                      if (!bVar2) {
                                                        local_6c8.pApplicationName = (char *)0x0;
                                                        local_6c8.pEngineName = "test5";
                                                        bVar2 = Fossilize::ApplicationInfoFilter::
                                                                should_record_immutable_samplers
                                                                          (this,&local_6c8);
                                                        if (!bVar2) {
                                                          local_6c8.pEngineName = "test6";
                                                          bVar2 = Fossilize::ApplicationInfoFilter::
                                                                  should_record_immutable_samplers
                                                                            (this,&local_6c8);
                                                          if (bVar2) {
                                                            remove(".__test_appinfo.json");
                                                            iVar6 = 0;
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00104081:
    std::
    unique_ptr<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
    ::~unique_ptr((unique_ptr<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                   *)&local_610);
  }
  return iVar6;
}

Assistant:

int main()
{
	const char *test_json =
R"delim(
{
	"asset": "FossilizeApplicationInfoFilter",
	"version" : 2,
	"blacklistedApplicationNames" : [ "A",  "B", "C" ],
	"blacklistedEngineNames" : [ "D", "E", "F" ],
	"applicationFilters" : {
		"test1" : { "minimumApplicationVersion" : 10 },
		"test2" : { "minimumApplicationVersion" : 10, "minimumEngineVersion" : 1000 },
		"test3" : { "minimumApiVersion" : 50 },
		"test4" : {
			"blacklistedEnvironments" : {
				"TEST_ENV" : { "contains" : "foo", "equals" : "bar" },
				"TEST_ENV" : { "equals" : "bar2", "contains": "" },
				"TEST" : { "nonnull" : true }
			}
		},
		"test5" : { "recordImmutableSamplers" : true },
		"test6" : { "recordImmutableSamplers" : false }
	},
	"engineFilters" : {
		"test1" : {
			"minimumEngineVersion" : 10,
			"bucketVariantDependencies" : [
				"BindlessUBO",
				"VendorID",
				"MutableDescriptorType",
				"BufferDeviceAddress",
				"DummyIgnored",
				"ApplicationName",
				"FragmentShadingRate",
				"DynamicRendering"
			]
		},
		"variance" : {
			"bucketVariantDependencies" : [ "VendorID" ]
		},
		"variance2" : {
			"bucketVariantDependencies" : [ "VendorID" ],
			"bucketVariantFeatureDependencies" : [
				"BindlessUBO",
				"MutableDescriptorType",
				"BufferDeviceAddress",
				"DummyIgnored",
				"FragmentShadingRate",
				"DynamicRendering",
				"DescriptorBuffer"
			]
		},
		"test2" : { "minimumEngineVersion" : 10, "minimumApplicationVersion" : 1000 },
		"test3" : { "minimumApiVersion" : 50 },
		"test4" : {
			"blacklistedEnvironments" : {
				"TEST_ENV" : { "contains" : "foo", "equals" : "bar" },
				"TEST_ENV" : { "equals" : "bar2", "contains": "" },
				"TEST" : { "nonnull" : true }
			}
		},
		"test5" : { "recordImmutableSamplers" : false },
		"test6" : { "recordImmutableSamplers" : true }
	},
	"defaultBucketVariantDependencies" : [
		"ApplicationName",
		"EngineName"
	],
	"defaultBucketVariantFeatureDependencies" : [
		"DescriptorBuffer"
	]
}
)delim";

	if (!write_string_to_file(".__test_appinfo.json", test_json))
		return EXIT_FAILURE;

	struct UserData
	{
		const char *env = nullptr;
		const char *data = nullptr;
	} data = {};

	const auto getenv_wrapper = +[](const char *env, void *userdata) -> const char *
	{
		auto *env_data = static_cast<const UserData *>(userdata);
		if (env_data->env && strcmp(env_data->env, env) == 0)
			return env_data->data;
		else
			return nullptr;
	};

	std::unique_ptr<Fossilize::ApplicationInfoFilter> filter_handle;
	filter_handle.reset(Fossilize::ApplicationInfoFilter::parse(".__test_appinfo.json",
																getenv_wrapper, &data));

	if (!filter_handle)
	{
		LOGE("Parsing did not complete successfully.\n");
		return EXIT_FAILURE;
	}

	auto &filter = *filter_handle;

	VkApplicationInfo appinfo = { VK_STRUCTURE_TYPE_APPLICATION_INFO };

	if (!filter.test_application_info(nullptr))
		return EXIT_FAILURE;

	// Test blacklists
	appinfo.pApplicationName = "A";
	appinfo.pEngineName = "G";
	if (filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	appinfo.pApplicationName = "D";
	appinfo.pEngineName = "A";
	if (!filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	appinfo.pApplicationName = "H";
	appinfo.pEngineName = "E";
	if (filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	// Test application version filtering
	appinfo.pApplicationName = "test1";
	appinfo.pEngineName = nullptr;
	appinfo.applicationVersion = 9;
	if (filter.test_application_info(&appinfo))
		return EXIT_FAILURE;
	appinfo.applicationVersion = 10;
	if (!filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	// Engine version should be ignored for appinfo filters.
	appinfo.pApplicationName = "test2";
	if (!filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	appinfo.pApplicationName = "test3";
	appinfo.applicationVersion = 0;
	appinfo.apiVersion = 49;
	if (filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	appinfo.apiVersion = 50;
	if (!filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	// Test engine version filtering
	appinfo.pApplicationName = nullptr;
	appinfo.pEngineName = "test1";
	appinfo.engineVersion = 9;
	if (filter.test_application_info(&appinfo))
		return EXIT_FAILURE;
	appinfo.engineVersion = 10;
	if (!filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	// Engine version should be ignored for appinfo filters.
	appinfo.pEngineName = "test2";
	if (!filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	appinfo.pEngineName = "test3";
	appinfo.engineVersion = 0;
	appinfo.apiVersion = 49;
	if (filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	appinfo.apiVersion = 50;
	if (!filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	appinfo.engineVersion = 0;
	appinfo.applicationVersion = 0;

	for (unsigned i = 0; i < 2; i++)
	{
		data = {};

		// Test env blacklisting (application)
		if (i == 0)
		{
			appinfo.pApplicationName = "test4";
			appinfo.pEngineName = nullptr;
		}
		else
		{
			appinfo.pEngineName = "test4";
			appinfo.pApplicationName = nullptr;
		}

		if (!filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		data.env = "TEST_FOO";
		data.data = "foo";

		if (!filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		// Contains test, should fail
		data.env = "TEST_ENV";

		data.data = "foo";
		if (filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		data.data = "Afoo";
		if (filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		data.data = "fooA";
		if (filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		// Equals bar, should fail
		data.data = "bar";
		if (filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		// Equals bar2, should fail
		data.data = "bar2";
		if (filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		// Should not fail
		data.data = "bar3";
		if (!filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		// Should not fail
		data.env = "TEST";
		data.data = nullptr;
		if (!filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		// Should fail
		data.data = "";
		if (filter.test_application_info(&appinfo))
			return EXIT_FAILURE;
	}

	// Test bucket variant filter.
	appinfo.pEngineName = nullptr;
	appinfo.pApplicationName = "test1";
	if (!filter.needs_buckets(&appinfo))
		return EXIT_FAILURE;

	appinfo.pEngineName = "test1";
	appinfo.pApplicationName = nullptr;
	if (!filter.needs_buckets(&appinfo))
		return EXIT_FAILURE;

	{
		// Make sure this doesn't crash.
		filter.get_bucket_hash(nullptr, nullptr, nullptr);

		auto hash0 = filter.get_bucket_hash(nullptr, &appinfo, nullptr);
		VkPhysicalDeviceProperties2 props2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2 };
		props2.properties.vendorID = 1;
		auto hash1 = filter.get_bucket_hash(&props2, &appinfo, nullptr);
		if (hash0 == hash1)
			return EXIT_FAILURE;

		VkPhysicalDeviceBufferDeviceAddressFeatures bda_features = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES };
		VkPhysicalDeviceVulkan12Features vulkan12_features = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES };
		VkPhysicalDeviceVulkan13Features vulkan13_features = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_3_FEATURES };
		VkPhysicalDeviceDescriptorIndexingFeatures indexing_features = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_FEATURES };
		VkPhysicalDeviceMutableDescriptorTypeFeaturesEXT mutable_features = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MUTABLE_DESCRIPTOR_TYPE_FEATURES_EXT };
		VkPhysicalDeviceFragmentShadingRateFeaturesKHR vrs_features = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR };
		VkPhysicalDeviceDynamicRenderingFeatures dynamic_rendering_features = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DYNAMIC_RENDERING_FEATURES };

		bda_features.pNext = &indexing_features;
		indexing_features.pNext = &mutable_features;
		VkPhysicalDeviceFeatures2 features2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
		features2.pNext = &bda_features;

		auto hash2 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash1 != hash2)
			return EXIT_FAILURE;

		// Try to enable one feature at a time and verify it's the same.
		bda_features.bufferDeviceAddress = VK_TRUE;
		auto hash3 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash2 == hash3)
			return EXIT_FAILURE;

		indexing_features.descriptorBindingUniformBufferUpdateAfterBind = VK_TRUE;
		auto hash4 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash3 == hash4)
			return EXIT_FAILURE;

		mutable_features.mutableDescriptorType = VK_TRUE;
		auto hash5 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash4 == hash5)
			return EXIT_FAILURE;

		// Verify that the 1.2 structs can also be used.
		mutable_features.pNext = &vulkan12_features;
		features2.pNext = &mutable_features;
		vulkan12_features.descriptorBindingUniformBufferUpdateAfterBind = VK_TRUE;
		vulkan12_features.bufferDeviceAddress = VK_TRUE;
		auto hash6 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash5 != hash6)
			return EXIT_FAILURE;

		features2.pNext = nullptr;
		auto hash7 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		features2.pNext = &vrs_features;
		auto hash8 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash7 != hash8)
			return EXIT_FAILURE;
		vrs_features.primitiveFragmentShadingRate = VK_TRUE;
		auto hash9 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash8 == hash9)
			return EXIT_FAILURE;
		vrs_features.primitiveFragmentShadingRate = VK_FALSE;
		vrs_features.pipelineFragmentShadingRate = VK_TRUE;
		auto hash10 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash9 == hash10)
			return EXIT_FAILURE;
		vrs_features.pipelineFragmentShadingRate = VK_FALSE;
		vrs_features.attachmentFragmentShadingRate = VK_TRUE;
		auto hash11 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash10 == hash11)
			return EXIT_FAILURE;

		features2.pNext = nullptr;
		auto hash12 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		features2.pNext = &dynamic_rendering_features;
		auto hash13 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash12 != hash13)
			return EXIT_FAILURE;
		dynamic_rendering_features.dynamicRendering = VK_TRUE;
		auto hash14 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash13 == hash14)
			return EXIT_FAILURE;
		vulkan13_features.dynamicRendering = VK_TRUE;
		features2.pNext = &vulkan13_features;
		auto hash15 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash14 != hash15)
			return EXIT_FAILURE;

		// Spot check for ApplicationName.
		appinfo.pApplicationName = "foo";
		auto hash16 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash16 == hash15)
			return EXIT_FAILURE;

		// Check that the default variant hash is used.
		appinfo.pApplicationName = "blah";
		appinfo.pEngineName = "blah2";
		auto hash17 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		auto hash18 = filter.get_bucket_hash(&props2, &appinfo, nullptr);
		if (hash17 != hash18)
			return EXIT_FAILURE;
	}

	// Test that feature hashing works as intended.
	{
		VkPhysicalDeviceProperties2 props2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2 };
		VkPhysicalDeviceFeatures2 features2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
		VkPhysicalDeviceBufferDeviceAddressFeatures bda_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES };
		VkPhysicalDeviceVulkan12Features vulkan12_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES };
		VkPhysicalDeviceVulkan13Features vulkan13_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_3_FEATURES };
		VkPhysicalDeviceDescriptorIndexingFeatures indexing_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_FEATURES };
		VkPhysicalDeviceMutableDescriptorTypeFeaturesEXT mutable_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MUTABLE_DESCRIPTOR_TYPE_FEATURES_EXT };
		VkPhysicalDeviceFragmentShadingRateFeaturesKHR vrs_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR };
		VkPhysicalDeviceDescriptorBufferFeaturesEXT descriptor_buffer_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT };

		props2.properties.vendorID = 1;
		appinfo.pEngineName = "variance";
		appinfo.pApplicationName = nullptr;

		auto hash0 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		appinfo.pEngineName = "variance2";
		auto hash1 = filter.get_bucket_hash(&props2, &appinfo, &features2);

		if (hash0 != hash1)
			return EXIT_FAILURE;

		// Ensure that hashing disabled structs does not change anything either.
		features2.pNext = &descriptor_buffer_features;
		if (filter.get_bucket_hash(&props2, &appinfo, &features2) != hash1)
			return EXIT_FAILURE;

		features2.pNext = &bda_features;
		if (filter.get_bucket_hash(&props2, &appinfo, &features2) != hash1)
			return EXIT_FAILURE;

		features2.pNext = &vulkan12_features;
		if (filter.get_bucket_hash(&props2, &appinfo, &features2) != hash1)
			return EXIT_FAILURE;

		features2.pNext = &vulkan13_features;
		if (filter.get_bucket_hash(&props2, &appinfo, &features2) != hash1)
			return EXIT_FAILURE;

		features2.pNext = &indexing_features;
		if (filter.get_bucket_hash(&props2, &appinfo, &features2) != hash1)
			return EXIT_FAILURE;

		features2.pNext = &mutable_features;
		if (filter.get_bucket_hash(&props2, &appinfo, &features2) != hash1)
			return EXIT_FAILURE;

		features2.pNext = &vrs_features;
		if (filter.get_bucket_hash(&props2, &appinfo, &features2) != hash1)
			return EXIT_FAILURE;

		features2.pNext = &descriptor_buffer_features;
		descriptor_buffer_features.descriptorBuffer = VK_TRUE;
		auto hash2 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		descriptor_buffer_features.descriptorBufferPushDescriptors = VK_TRUE;
		auto hash3 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash1 == hash2 || hash2 == hash3)
			return EXIT_FAILURE;

		features2.pNext = &bda_features;
		bda_features.bufferDeviceAddress = VK_TRUE;
		hash2 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash1 == hash2)
			return EXIT_FAILURE;
		features2.pNext = &vulkan12_features;
		vulkan12_features.bufferDeviceAddress = VK_TRUE;
		hash3 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash2 != hash3)
			return EXIT_FAILURE;
	}

	// Test that we can pick up defaultFeatureVariantFilter.
	{
		VkPhysicalDeviceProperties2 props2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2 };
		VkPhysicalDeviceFeatures2 features2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
		VkPhysicalDeviceBufferDeviceAddressFeatures bda_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES };
		VkPhysicalDeviceDescriptorBufferFeaturesEXT descriptor_buffer_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT };

		props2.properties.vendorID = 1;
		appinfo.pEngineName = nullptr;
		appinfo.pApplicationName = nullptr;

		auto hash0 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		features2.pNext = &bda_features;
		bda_features.bufferDeviceAddress = VK_TRUE;
		auto hash1 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		features2.pNext = &descriptor_buffer_features;
		auto hash2 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		descriptor_buffer_features.descriptorBuffer = VK_TRUE;
		auto hash3 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		descriptor_buffer_features.descriptorBufferPushDescriptors = VK_TRUE;
		auto hash4 = filter.get_bucket_hash(&props2, &appinfo, &features2);

		if (hash0 != hash1 || hash1 != hash2)
			return EXIT_FAILURE;
		if (hash2 == hash3 || hash3 == hash4)
			return EXIT_FAILURE;
	}

	{
		appinfo.pApplicationName = "test5";
		appinfo.pEngineName = nullptr;
		if (!filter.should_record_immutable_samplers(&appinfo))
			return EXIT_FAILURE;
		appinfo.pApplicationName = "test6";
		if (filter.should_record_immutable_samplers(&appinfo))
			return EXIT_FAILURE;
		appinfo.pApplicationName = nullptr;
		appinfo.pEngineName = "test5";
		if (filter.should_record_immutable_samplers(&appinfo))
			return EXIT_FAILURE;
		appinfo.pEngineName = "test6";
		if (!filter.should_record_immutable_samplers(&appinfo))
			return EXIT_FAILURE;
	}

	remove(".__test_appinfo.json");
}